

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O1

int __thiscall
llvm::MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(MCRegisterInfo *this,uint RegNum)

{
  int iVar1;
  Optional<unsigned_int> OVar2;
  
  OVar2 = getLLVMRegNum(this,RegNum,true);
  if (((ulong)OVar2.Storage >> 0x20 & 1) == 0) {
    return RegNum;
  }
  iVar1 = getDwarfRegNum(this,(MCRegister)OVar2.Storage.field_0,false);
  return iVar1;
}

Assistant:

int MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(unsigned RegNum) const {
  // On ELF platforms, DWARF EH register numbers are the same as DWARF
  // other register numbers.  On Darwin x86, they differ and so need to be
  // mapped.  The .cfi_* directives accept integer literals as well as
  // register names and should generate exactly what the assembly code
  // asked for, so there might be DWARF/EH register numbers that don't have
  // a corresponding LLVM register number at all.  So if we can't map the
  // EH register number to an LLVM register number, assume it's just a
  // valid DWARF register number as is.
  if (Optional<unsigned> LRegNum = getLLVMRegNum(RegNum, true))
    return getDwarfRegNum(*LRegNum, false);
  return RegNum;
}